

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-utf8.c
# Opt level: O2

void test_bson_utf8_non_shortest(void)

{
  char *pcVar1;
  char cVar2;
  size_t sVar3;
  undefined8 uVar4;
  ulong uVar5;
  char **ppcVar6;
  
  ppcVar6 = test_bson_utf8_non_shortest::tests;
  uVar5 = 0;
  do {
    if (uVar5 == 5) {
      ppcVar6 = test_bson_utf8_non_shortest::valid_tests;
      uVar5 = 0;
      while( true ) {
        if (uVar5 == 1) {
          return;
        }
        pcVar1 = *ppcVar6;
        sVar3 = strlen(pcVar1);
        cVar2 = bson_utf8_validate(pcVar1,sVar3,1);
        if (cVar2 == '\0') break;
        uVar5 = uVar5 + 1;
        ppcVar6 = ppcVar6 + 1;
      }
      fprintf(_stderr,"non-shortest form failure, valid_tests %d\n",uVar5 & 0xffffffff);
      uVar4 = 0xf0;
LAB_0012cd9c:
      fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-utf8.c"
              ,uVar4,"test_bson_utf8_non_shortest","false");
      abort();
    }
    pcVar1 = *ppcVar6;
    sVar3 = strlen(pcVar1);
    cVar2 = bson_utf8_validate(pcVar1,sVar3,0);
    if (cVar2 != '\0') {
      fprintf(_stderr,"non-shortest form failure, test %d\n",uVar5 & 0xffffffff);
      uVar4 = 0xe9;
      goto LAB_0012cd9c;
    }
    uVar5 = uVar5 + 1;
    ppcVar6 = ppcVar6 + 1;
  } while( true );
}

Assistant:

static void
test_bson_utf8_non_shortest (void)
{
   static const char *tests[] = {
      "\xE0\x80\x80",     /* Non-shortest form representation of U+0000 */
      "\xF0\x80\x80\x80", /* Non-shortest form representation of U+0000 */

      "\xE0\x83\xBF",     /* Non-shortest form representation of U+00FF */
      "\xF0\x80\x83\xBF", /* Non-shortest form representation of U+00FF */

      "\xF0\x80\xA3\x80", /* Non-shortest form representation of U+08C0 */

      NULL};
   static const char *valid_tests[] = {
      "\xC0\x80", /* Non-shortest form representation of U+0000.
                   * This is how \0 should be encoded. Special casing
                   * to allow for use in things like strlen(). */

      NULL};
   int i;

   for (i = 0; tests[i]; i++) {
      if (bson_utf8_validate (tests[i], strlen (tests[i]), false)) {
         fprintf (stderr, "non-shortest form failure, test %d\n", i);
         BSON_ASSERT (false);
      }
   }

   for (i = 0; valid_tests[i]; i++) {
      if (!bson_utf8_validate (valid_tests[i], strlen (valid_tests[i]), true)) {
         fprintf (stderr, "non-shortest form failure, valid_tests %d\n", i);
         BSON_ASSERT (false);
      }
   }
}